

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parser::try_match(parser *this,arg_string *arg)

{
  bool bVar1;
  pattern *ppVar2;
  parameter *ppVar3;
  size_type sVar4;
  size_type sVar5;
  select_all local_209;
  arg_string local_208;
  select_values local_1e2;
  select_flags local_1e1;
  arg_string local_1e0;
  select_flags local_1bd [13];
  scoped_dfs_traverser local_1b0;
  arg_string local_110;
  match_t local_f0;
  undefined1 local_30 [8];
  subrange match;
  arg_string *arg_local;
  parser *this_local;
  
  match.length_ = (size_type)arg;
  ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
  bVar1 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar2);
  if (bVar1) {
    ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(ppVar2);
    if (bVar1) {
      ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
      ppVar3 = group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar2);
      bVar1 = parameter::greedy(ppVar3);
      if (bVar1) {
        ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
        ppVar3 = group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar2);
        _local_30 = parameter::match(ppVar3,(arg_string *)match.length_);
        bVar1 = subrange::operator_cast_to_bool((subrange *)local_30);
        if (bVar1) {
          sVar4 = subrange::length((subrange *)local_30);
          sVar5 = std::__cxx11::string::size();
          if (sVar4 == sVar5) {
            std::__cxx11::string::string((string *)&local_110,(string *)match.length_);
            detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_1b0,&this->pos_);
            detail::match_t::match_t(&local_f0,&local_110,&local_1b0);
            add_match(this,&local_f0);
            detail::match_t::~match_t(&local_f0);
            detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_1b0);
            std::__cxx11::string::~string((string *)&local_110);
            return true;
          }
        }
      }
    }
  }
  bVar1 = try_match_full<clipp::detail::select_flags>(this,(arg_string *)match.length_,local_1bd);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = try_match_joined_flags(this,(arg_string *)match.length_);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_1e0,(string *)match.length_);
      bVar1 = try_match_joined_sequence<clipp::detail::select_flags>(this,&local_1e0,&local_1e1);
      std::__cxx11::string::~string((string *)&local_1e0);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = try_match_full<clipp::detail::select_values>
                          (this,(arg_string *)match.length_,&local_1e2);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          std::__cxx11::string::string((string *)&local_208,(string *)match.length_);
          bVar1 = try_match_joined_sequence<clipp::detail::select_all>(this,&local_208,&local_209);
          std::__cxx11::string::~string((string *)&local_208);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = try_match_joined_params(this,(arg_string *)match.length_);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool try_match(const arg_string& arg)
    {
        //match greedy parameters before everything else
        if(pos_->is_param() && pos_->blocking() && pos_->as_param().greedy()) {
            const auto match = pos_->as_param().match(arg);
            if(match && match.length() == arg.size()) {
                add_match(detail::match_t{arg,pos_});
                return true;
            }
        }

        //try flags first (alone, joinable or strict sequence)
        if(try_match_full(arg, detail::select_flags{})) return true;
        if(try_match_joined_flags(arg)) return true;
        if(try_match_joined_sequence(arg, detail::select_flags{})) return true;
        //try value params (alone or strict sequence)
        if(try_match_full(arg, detail::select_values{})) return true;
        if(try_match_joined_sequence(arg, detail::select_all{})) return true;
        //try joinable params + values in any order
        if(try_match_joined_params(arg)) return true;
        return false;
    }